

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::FindRequiresForMessage
          (Generator *this,GeneratorOptions *options,Descriptor *desc,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards,bool *have_message)

{
  long lVar1;
  int iVar2;
  long lVar3;
  Generator *this_00;
  long lVar4;
  
  *have_message = true;
  this_00 = this;
  if (0 < *(int *)(desc + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(desc + 0x30);
      if (*(char *)(lVar1 + 0x50 + lVar3) == '\x01') {
        this_00 = (Generator *)**(undefined8 **)(*(long *)(lVar1 + 0x58 + lVar3) + 0x10);
        iVar2 = std::__cxx11::string::compare((char *)this_00);
        if (iVar2 != 0) goto LAB_0021f910;
      }
      else {
LAB_0021f910:
        FindRequiresForField(this_00,options,(FieldDescriptor *)(lVar1 + lVar3),required,forwards);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(desc + 0x2c));
  }
  if (0 < *(int *)(desc + 0x78)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(desc + 0x80);
      if (*(char *)(lVar1 + 0x50 + lVar3) == '\x01') {
        this_00 = (Generator *)**(undefined8 **)(*(long *)(lVar1 + 0x58 + lVar3) + 0x10);
        iVar2 = std::__cxx11::string::compare((char *)this_00);
        if (iVar2 != 0) goto LAB_0021f977;
      }
      else {
LAB_0021f977:
        FindRequiresForExtension
                  (this_00,options,(FieldDescriptor *)(lVar1 + lVar3),required,forwards);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(desc + 0x78));
  }
  if (0 < *(int *)(desc + 0x48)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      FindRequiresForMessage
                (this,options,(Descriptor *)(*(long *)(desc + 0x50) + lVar3),required,forwards,
                 have_message);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(desc + 0x48));
  }
  return;
}

Assistant:

void Generator::FindRequiresForMessage(
    const GeneratorOptions& options,
    const Descriptor* desc,
    std::set<string>* required,
    std::set<string>* forwards,
    bool* have_message) const {


  if (!NamespaceOnly(desc)) {
    *have_message = true;
    for (int i = 0; i < desc->field_count(); i++) {
      const FieldDescriptor* field = desc->field(i);
      if (IgnoreField(field)) {
        continue;
      }
      FindRequiresForField(options, field, required, forwards);
    }
  }

  for (int i = 0; i < desc->extension_count(); i++) {
    const FieldDescriptor* field = desc->extension(i);
    if (IgnoreField(field)) {
      continue;
    }
    FindRequiresForExtension(options, field, required, forwards);
  }

  for (int i = 0; i < desc->nested_type_count(); i++) {
    FindRequiresForMessage(options, desc->nested_type(i), required, forwards,
                           have_message);
  }
}